

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

NFRuleSet * __thiscall
icu_63::RuleBasedNumberFormat::findRuleSet
          (RuleBasedNumberFormat *this,UnicodeString *name,UErrorCode *status)

{
  NFRuleSet *this_00;
  UBool UVar1;
  NFRuleSet *rs;
  NFRuleSet **p;
  UErrorCode *status_local;
  UnicodeString *name_local;
  RuleBasedNumberFormat *this_local;
  
  UVar1 = ::U_SUCCESS(*status);
  if ((UVar1 != '\0') && (this->fRuleSets != (NFRuleSet **)0x0)) {
    for (rs = (NFRuleSet *)this->fRuleSets; *(long *)rs != 0; rs = (NFRuleSet *)&rs->name) {
      this_00 = *(NFRuleSet **)rs;
      UVar1 = NFRuleSet::isNamed(this_00,name);
      if (UVar1 != '\0') {
        return this_00;
      }
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (NFRuleSet *)0x0;
}

Assistant:

NFRuleSet*
RuleBasedNumberFormat::findRuleSet(const UnicodeString& name, UErrorCode& status) const
{
    if (U_SUCCESS(status) && fRuleSets) {
        for (NFRuleSet** p = fRuleSets; *p; ++p) {
            NFRuleSet* rs = *p;
            if (rs->isNamed(name)) {
                return rs;
            }
        }
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    return NULL;
}